

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultNamerDisposer.cpp
# Opt level: O1

void __thiscall
ApprovalTests::DefaultNamerDisposer::~DefaultNamerDisposer(DefaultNamerDisposer *this)

{
  _Manager_type p_Var1;
  _Any_data _Stack_28;
  code *local_18;
  
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::function
            ((function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> *)&_Stack_28,
             &this->previous_result);
  DefaultNamerFactory::setDefaultNamer((NamerCreator *)&_Stack_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&_Stack_28,&_Stack_28,__destroy_functor);
  }
  p_Var1 = (this->previous_result).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

DefaultNamerDisposer::~DefaultNamerDisposer()
    {
        DefaultNamerFactory::setDefaultNamer(previous_result);
    }